

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_writers.h
# Opt level: O0

void cppwinrt::write_component_composable_forwarder(writer *w,MethodDef *method)

{
  uint32_t *puVar1;
  RetTypeSig *args_2;
  anon_class_8_1_89897ddb_conflict1 local_2b0;
  anon_class_8_1_89897ddb_conflict1 local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  basic_string_view<char,_std::char_traits<char>_> local_290;
  pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *local_280;
  pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *local_278;
  __normal_iterator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
  local_270;
  __normal_iterator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
  local_268;
  __normal_iterator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
  local_260;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *local_258;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *params;
  undefined1 local_240 [8];
  method_signature reordered_method;
  method_signature signature;
  char *format;
  MethodDef *method_local;
  writer *w_local;
  
  puVar1 = &reordered_method.m_return.super_row_base<winmd::reader::Param>.m_index;
  method_signature::method_signature((method_signature *)puVar1,method);
  method_signature::method_signature((method_signature *)local_240,(method_signature *)puVar1);
  local_258 = method_signature::params((method_signature *)local_240);
  local_260._M_current =
       (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
       std::
       vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
       ::begin(local_258);
  local_270._M_current =
       (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
       std::
       vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
       ::end(local_258);
  local_268 = __gnu_cxx::
              __normal_iterator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
              ::operator-(&local_270,2);
  local_278 = (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
              std::
              vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
              ::end(local_258);
  local_280 = (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
              ::std::_V2::
              rotate<__gnu_cxx::__normal_iterator<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>*,std::vector<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>,std::allocator<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>>>>>
                        (local_260,local_268,
                         (__normal_iterator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
                          )local_278);
  w->param_names = true;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_290,
             "        auto %(%)\n        {\n            return impl::composable_factory<T>::template CreateInstance<%>(%);\n        }\n"
            );
  local_2a0 = get_name(method);
  puVar1 = &reordered_method.m_return.super_row_base<winmd::reader::Param>.m_index;
  local_2a8 = bind<&cppwinrt::write_implementation_params,_cppwinrt::method_signature_&>
                        ((method_signature *)puVar1);
  args_2 = method_signature::return_signature((method_signature *)puVar1);
  local_2b0 = bind<&cppwinrt::write_consume_args,_cppwinrt::method_signature_&>
                        ((method_signature *)local_240);
  writer_base<cppwinrt::writer>::
  write<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_winmd::reader::RetTypeSig,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_290,&local_2a0,&local_2a8,args_2,
             &local_2b0);
  method_signature::~method_signature((method_signature *)local_240);
  method_signature::~method_signature
            ((method_signature *)
             &reordered_method.m_return.super_row_base<winmd::reader::Param>.m_index);
  return;
}

Assistant:

static void write_component_composable_forwarder(writer& w, MethodDef const& method)
    {
        auto format = R"(        auto %(%)
        {
            return impl::composable_factory<T>::template CreateInstance<%>(%);
        }
)";

        method_signature signature{ method };
        method_signature reordered_method = signature;
        auto&& params = reordered_method.params();
        std::rotate(params.begin(), params.end() - 2, params.end());
        w.param_names = true;

        w.write(format,
            get_name(method),
            bind<write_implementation_params>(signature),
            signature.return_signature(),
            bind<write_consume_args>(reordered_method));
    }